

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  undefined1 local_78 [8];
  Value decoded;
  undefined1 local_40 [8];
  string decoded_string;
  Token *token_local;
  OurReader *this_local;
  
  decoded_string.field_2._8_8_ = token;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = decodeString(this,(Token *)decoded_string.field_2._8_8_,(string *)local_40);
  if (bVar1) {
    Value::Value((Value *)local_78,(string *)local_40);
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)local_78);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,*(long *)(decoded_string.field_2._8_8_ + 8) - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit
              (pVVar2,*(long *)(decoded_string.field_2._8_8_ + 0x10) - (long)this->begin_);
    decoded.limit_._0_4_ = 1;
    Value::~Value((Value *)local_78);
  }
  else {
    decoded.limit_._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool OurReader::decodeString(Token& token) {
  JSONCPP_STRING decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}